

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApertureILS.cpp
# Opt level: O2

double __thiscall
imrt::ApertureILS::improvementIntensity
          (ApertureILS *this,int beamlet,Station *station,bool open_beamlet,double c_eval,Plan *P,
          bool best_improvement)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  ulong unaff_RBX;
  int iVar5;
  bool bVar6;
  byte bVar7;
  double local_b0;
  vector<int,_std::allocator<int>_> a_list;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> diff;
  _List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> local_60;
  double local_48;
  undefined8 uStack_40;
  
  diff.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&diff;
  diff.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
  _M_node._M_size = 0;
  a_list.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  a_list.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  a_list.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  diff.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
  _M_node.super__List_node_base._M_prev =
       diff.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
       _M_impl._M_node.super__List_node_base._M_next;
  Station::getOpen((vector<int,_std::allocator<int>_> *)&local_60,station,beamlet);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&a_list,&local_60);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_60);
  if (a_list.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
      == a_list.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start) {
    std::operator<<((ostream *)&std::cout,"[NOPT] ");
    local_b0 = c_eval;
  }
  else {
    iVar1 = rand();
    iVar5 = 0;
    uVar4 = (ulong)(long)iVar1 %
            (ulong)((long)a_list.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)a_list.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2);
    bVar6 = true;
    local_48 = -1.0;
    uStack_40 = 0;
    while (bVar6) {
      iVar1 = (int)uVar4;
      if (open_beamlet) {
        Station::modifyIntensityAperture_abi_cxx11_
                  ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                   &local_60,station,
                   a_list.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar1],(double)this->step_intensity);
      }
      else {
        Station::modifyIntensityAperture_abi_cxx11_
                  ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                   &local_60,station,
                   a_list.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar1],(double)-this->step_intensity);
      }
      std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
      _M_move_assign(&diff,&local_60);
      std::__cxx11::_List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
      _M_clear(&local_60);
      local_b0 = Plan::incremental_eval(P,station,&diff);
      bVar7 = -(0.0 <= local_48) & -(local_48 - local_b0 <= 1e-05);
      if ((bVar7 & 1) == 0) {
        uStack_40 = 0;
        unaff_RBX = uVar4;
        local_48 = local_b0;
      }
      unaff_RBX = unaff_RBX & 0xffffffff;
      if (((bVar7 | best_improvement) & 1) == 0) goto LAB_0011fc6c;
      Station::undoLast_abi_cxx11_
                ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)&local_60
                 ,station);
      std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
      _M_move_assign(&diff,&local_60);
      std::__cxx11::_List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
      _M_clear(&local_60);
      if (diff.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl._M_node._M_size != 0) {
        Plan::incremental_eval(P,station,&diff);
      }
      iVar5 = iVar5 + 1;
      if ((bVar7 & 1) == 0) {
        iVar5 = 1;
      }
      lVar2 = (long)a_list.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)a_list.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2;
      uVar3 = 0;
      if (lVar2 != (int)(iVar1 + 1U)) {
        uVar3 = iVar1 + 1U;
      }
      bVar6 = lVar2 != iVar5;
      uVar4 = (ulong)uVar3;
    }
    if (open_beamlet) {
      Station::modifyIntensityAperture_abi_cxx11_
                ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)&local_60
                 ,station,a_list.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[(int)unaff_RBX],-1.0);
    }
    else {
      Station::modifyIntensityAperture_abi_cxx11_
                ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)&local_60
                 ,station,a_list.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[(int)unaff_RBX],1.0);
    }
    std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
    _M_move_assign(&diff,&local_60);
    std::__cxx11::_List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
    _M_clear(&local_60);
    local_b0 = Plan::incremental_eval(P,station,&diff);
  }
LAB_0011fc6c:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&a_list.super__Vector_base<int,_std::allocator<int>_>);
  std::__cxx11::_List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
  _M_clear(&diff.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)
  ;
  return local_b0;
}

Assistant:

double ApertureILS::improvementIntensity(int beamlet, Station& station, bool open_beamlet, 
                                         double c_eval, Plan & P, bool best_improvement) {
  
  double local_best =-1, aux_eval=0;
  list<pair<int, double> > diff;
  int a, local_a, i;
  bool flag = true;
  vector<int> a_list;
  
  a_list = station.getOpen(beamlet);
  
  if (a_list.size()<1) {
    //cout << endl << "Warning: not possible to make intensity change beamlet:" << beamlet <<endl;
    cout << "[NOPT] ";
    return(c_eval);
  }
  
  a = (int)rand() % a_list.size();
  i=0;

  // Check every aperture 
  while(flag) {
    if (open_beamlet) {
      diff = station.modifyIntensityAperture(a_list[a], step_intensity);
      aux_eval = P.incremental_eval(station, diff);
      //cout << endl<<"  Increasing intensity aperture: " << a <<" eval: " << aux_eval << " list: ";
      //for (list<pair<int,double> >::iterator it=aux_diff.begin();it!=aux_diff.end();it++) cout << it->first << " ";
      //cout << endl;
    } else {
      diff = station.modifyIntensityAperture(a_list[a], -step_intensity);
      aux_eval = P.incremental_eval(station, diff);
      //cout << endl<< "  Reducing intensity aperture: " << a <<" eval: " << aux_eval <<  " list: ";
      //for (list<pair<int,double> >::iterator it=aux_diff.begin();it!=aux_diff.end();it++) cout << it->first << " ";
      //cout << endl;
    }
    
    // First improvement
    if (local_best < 0 || (local_best- aux_eval)>0.00001){
      local_best=aux_eval;
      local_a=a;
      i=0; // to support best improvement
      if (!best_improvement)
        return(local_best);
    } 
    
    //Undo change
    diff = station.undoLast();
    if (diff.size()>0)
      aux_eval = P.incremental_eval(station, diff);
    
    i++;
    a++;
    if (a==a_list.size()) a=0;
    if (i==a_list.size()) flag=false;
  }
  
  // If no improvement was found, return the best solution found.
  if (!open_beamlet) {
    diff = station.modifyIntensityAperture(a_list[local_a], 1);
    local_best = P.incremental_eval(station, diff);
  } else{
    diff = station.modifyIntensityAperture(a_list[local_a], -1);
    local_best = P.incremental_eval(station, diff);
  }
  return(local_best);
}